

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LogFinish(void)

{
  _func_void_void_ptr_char_ptr *p_Var1;
  ImGuiContext *pIVar2;
  char *pcVar3;
  
  pIVar2 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    switch(pIVar2->LogType) {
    case ImGuiLogType_None:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x2403,"void ImGui::LogFinish()");
    case ImGuiLogType_TTY:
      fflush((FILE *)pIVar2->LogFile);
      break;
    case ImGuiLogType_File:
      fclose((FILE *)pIVar2->LogFile);
      break;
    case ImGuiLogType_Clipboard:
      if ((1 < (pIVar2->LogBuffer).Buf.Size) &&
         (p_Var1 = (GImGui->IO).SetClipboardTextFn, p_Var1 != (_func_void_void_ptr_char_ptr *)0x0))
      {
        pcVar3 = (pIVar2->LogBuffer).Buf.Data;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = ImGuiTextBuffer::EmptyString;
        }
        (*p_Var1)((GImGui->IO).ClipboardUserData,pcVar3);
      }
    }
    pIVar2->LogEnabled = false;
    pIVar2->LogType = ImGuiLogType_None;
    pIVar2->LogFile = (FILE *)0x0;
    ImGuiTextBuffer::clear(&pIVar2->LogBuffer);
    return;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
        fflush(g.LogFile);
        break;
    case ImGuiLogType_File:
        fclose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}